

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O3

short gpu::deviceTypeMax<short>(void)

{
  Type TVar1;
  undefined2 extraout_AX;
  undefined2 extraout_var;
  undefined4 extraout_var_00;
  Context context;
  Context local_20;
  
  Context::Context(&local_20);
  TVar1 = Context::type(&local_20);
  if (TVar1 == TypeOpenCL) {
    if (local_20.data_ref_.super___shared_ptr<gpu::Context::Data,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_20.data_ref_.
                 super___shared_ptr<gpu::Context::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    return 0x7fff;
  }
  __cxa_allocate_exception(0x10);
  gpu_exception::gpu_exception
            ((gpu_exception *)CONCAT44(extraout_var_00,CONCAT22(extraout_var,extraout_AX)),
             "No GPU active context!");
  __cxa_throw(CONCAT44(extraout_var_00,CONCAT22(extraout_var,extraout_AX)),&gpu_exception::typeinfo,
              std::runtime_error::~runtime_error);
}

Assistant:

T gpu::deviceTypeMax() {
	Context context;
#ifdef CUDA_SUPPORT
	if (context.type() == Context::TypeCUDA) {
		return std::numeric_limits<T>::max();
	} else
#endif
	if (context.type() == Context::TypeOpenCL) {
		return ocl::OpenCLType<T>::max();
	} else {
		throw gpu_exception("No GPU active context!");
	}
}